

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ring_buffer.cpp
# Opt level: O3

void basic_api_test<ring_buffer_base<short>>(ring_buffer_base<short> *ring)

{
  uint uVar1;
  bool bVar2;
  AssertHelperData *this;
  stringstream *psVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  AssertionResult gtest_ar;
  int rv;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50 [2];
  AssertionResult local_40;
  int local_2c;
  AssertHelper local_28;
  
  local_58.data_._0_4_ = 0x80;
  local_50[0].ptr_._0_4_ = ring->capacity_ + -1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_40,"ring.capacity()","128",(int *)local_50,(int *)&local_58);
  if (local_40.success_ == false) {
    psVar3 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar3);
    *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
    if (local_40.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
    }
    iVar8 = 0x82;
    local_50[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
  }
  else {
    iVar6 = 0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_40.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
    iVar7 = (ring->write_index_).super___atomic_base<int>._M_i;
    if (iVar7 < iVar8) {
      iVar6 = ring->capacity_;
    }
    local_50[0].ptr_._0_4_ = (iVar7 - iVar8) + iVar6;
    local_58.data_ = local_58.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_40,"ring.available_read()","0",(int *)local_50,(int *)&local_58);
    if (local_40.success_ == false) {
      psVar3 = (stringstream *)operator_new(0x188);
      std::__cxx11::stringstream::stringstream(psVar3);
      *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
      if (local_40.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
      }
      iVar8 = 0x84;
      local_50[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
    }
    else {
      iVar7 = 0;
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_40.message_,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
      uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
      if (iVar8 <= (int)uVar1) {
        iVar7 = ring->capacity_;
      }
      local_50[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar7;
      local_58.data_._0_4_ = 0x80;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_40,"ring.available_write()","128",(int *)local_50,
                 (int *)&local_58);
      if (local_40.success_ == false) {
        psVar3 = (stringstream *)operator_new(0x188);
        std::__cxx11::stringstream::stringstream(psVar3);
        *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
        if (local_40.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
        }
        iVar8 = 0x85;
        local_50[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
      }
      else {
        iVar8 = 0;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_40.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_2c = ring_buffer_base<short>::enqueue(ring,(short *)0x0,0x3f);
        local_40.success_ = local_2c == 0x3f;
        local_40.message_.ptr_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!local_40.success_) {
          this = (AssertHelperData *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream((stringstream *)this);
          *(undefined8 *)((long)&(this->message).c_str_ + *(long *)(*(long *)&this->line + -0x18)) =
               0x11;
          local_58.data_ = this;
          testing::internal::GetBoolAssertionFailureMessage
                    ((internal *)local_50,&local_40,"rv == 63","false","true");
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                     ,0x89,(char *)local_50[0].ptr_);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_58);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          if (local_50[0].ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            operator_delete__(local_50[0].ptr_);
          }
          if (((local_58.data_ != (AssertHelperData *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_58.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)local_58.data_ + 8))();
          }
          goto LAB_00117476;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_40.message_,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar7 = (ring->read_index_).super___atomic_base<int>._M_i;
        iVar6 = (ring->write_index_).super___atomic_base<int>._M_i;
        if (iVar6 < iVar7) {
          iVar8 = ring->capacity_;
        }
        local_58.data_._0_4_ = 0x3f;
        local_50[0].ptr_._0_4_ = (iVar6 - iVar7) + iVar8;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_40,"ring.available_read()","63",(int *)local_50,
                   (int *)&local_58);
        if (local_40.success_ == false) {
          psVar3 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar3);
          *(undefined8 *)(psVar3 + *(long *)(*(long *)(psVar3 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_40.message_.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = "";
          }
          else {
            pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
          }
          iVar8 = 0x8a;
          local_50[0].ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar3;
        }
        else {
          iVar7 = 0;
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_40.message_,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
          uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
          if (iVar8 <= (int)uVar1) {
            iVar7 = ring->capacity_;
          }
          local_50[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar7;
          local_58.data_._0_4_ = 0x41;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_40,"ring.available_write()","65",(int *)local_50,
                     (int *)&local_58);
          if (local_40.success_ == false) {
            testing::Message::Message((Message *)local_50);
            if (local_40.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar5 = "";
            }
            else {
              pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
            }
            iVar8 = 0x8b;
          }
          else {
            iVar8 = 0;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_40.message_,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_2c = ring_buffer_base<short>::enqueue(ring,(short *)0x0,0x41);
            local_50[0].ptr_._0_4_ = 0x41;
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_40,"rv","65",&local_2c,(int *)local_50);
            if (local_40.success_ == false) {
              testing::Message::Message((Message *)local_50);
              if (local_40.message_.ptr_ ==
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                pcVar5 = "";
              }
              else {
                pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
              }
              iVar8 = 0x8f;
            }
            else {
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::reset(&local_40.message_,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
              iVar7 = (ring->read_index_).super___atomic_base<int>._M_i;
              iVar6 = (ring->write_index_).super___atomic_base<int>._M_i;
              if (iVar6 < iVar7) {
                iVar8 = ring->capacity_;
              }
              local_50[0].ptr_._0_4_ = (iVar6 - iVar7) + iVar8;
              local_58.data_._0_4_ = 0x80;
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_40,"ring.available_read()","128",(int *)local_50,
                         (int *)&local_58);
              if (local_40.success_ == false) {
                testing::Message::Message((Message *)local_50);
                if (local_40.message_.ptr_ ==
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  pcVar5 = "";
                }
                else {
                  pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                }
                iVar8 = 0x90;
              }
              else {
                iVar7 = 0;
                testing::internal::
                scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::reset(&local_40.message_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                if (iVar8 <= (int)uVar1) {
                  iVar7 = ring->capacity_;
                }
                local_50[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar7;
                local_58.data_ = local_58.data_ & 0xffffffff00000000;
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_40,"ring.available_write()","0",(int *)local_50,
                           (int *)&local_58);
                if (local_40.success_ == false) {
                  testing::Message::Message((Message *)local_50);
                  if (local_40.message_.ptr_ ==
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    pcVar5 = "";
                  }
                  else {
                    pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                  }
                  iVar8 = 0x91;
                }
                else {
                  testing::internal::
                  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::reset(&local_40.message_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
                  iVar8 = (ring->write_index_).super___atomic_base<int>._M_i;
                  iVar7 = (ring->read_index_).super___atomic_base<int>._M_i;
                  iVar6 = ring->capacity_;
                  local_2c = 0;
                  if (iVar8 != iVar7) {
                    iVar4 = 0;
                    if (iVar8 < iVar7) {
                      iVar4 = iVar6;
                    }
                    iVar4 = (iVar8 - iVar7) + iVar4;
                    local_2c = 0x3f;
                    if (iVar4 < 0x3f) {
                      local_2c = iVar4;
                    }
                    (ring->read_index_).super___atomic_base<int>._M_i = (iVar7 + local_2c) % iVar6;
                  }
                  iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                  iVar7 = (ring->write_index_).super___atomic_base<int>._M_i;
                  iVar4 = 0;
                  if (iVar7 < iVar8) {
                    iVar4 = iVar6;
                  }
                  local_50[0].ptr_._0_4_ = (iVar7 - iVar8) + iVar4;
                  local_58.data_._0_4_ = 0x41;
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_40,"ring.available_read()","65",(int *)local_50,
                             (int *)&local_58);
                  if (local_40.success_ == false) {
                    testing::Message::Message((Message *)local_50);
                    if (local_40.message_.ptr_ ==
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                      pcVar5 = "";
                    }
                    else {
                      pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                    }
                    iVar8 = 0x95;
                  }
                  else {
                    iVar7 = 0;
                    testing::internal::
                    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::reset(&local_40.message_,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                           );
                    iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                    uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                    if (iVar8 <= (int)uVar1) {
                      iVar7 = ring->capacity_;
                    }
                    local_50[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar7;
                    local_58.data_._0_4_ = 0x3f;
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_40,"ring.available_write()","63",(int *)local_50,
                               (int *)&local_58);
                    if (local_40.success_ == false) {
                      testing::Message::Message((Message *)local_50);
                      if (local_40.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      iVar8 = 0x96;
                    }
                    else {
                      testing::internal::
                      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::reset(&local_40.message_,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0);
                      iVar8 = (ring->write_index_).super___atomic_base<int>._M_i;
                      iVar7 = (ring->read_index_).super___atomic_base<int>._M_i;
                      iVar6 = ring->capacity_;
                      local_2c = 0;
                      if (iVar8 != iVar7) {
                        iVar4 = 0;
                        if (iVar8 < iVar7) {
                          iVar4 = iVar6;
                        }
                        iVar4 = (iVar8 - iVar7) + iVar4;
                        local_2c = 0x41;
                        if (iVar4 < 0x41) {
                          local_2c = iVar4;
                        }
                        (ring->read_index_).super___atomic_base<int>._M_i =
                             (iVar7 + local_2c) % iVar6;
                      }
                      iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                      iVar7 = (ring->write_index_).super___atomic_base<int>._M_i;
                      iVar4 = 0;
                      if (iVar7 < iVar8) {
                        iVar4 = iVar6;
                      }
                      local_50[0].ptr_._0_4_ = (iVar7 - iVar8) + iVar4;
                      local_58.data_ = local_58.data_ & 0xffffffff00000000;
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_40,"ring.available_read()","0",(int *)local_50,
                                 (int *)&local_58);
                      if (local_40.success_ != false) {
                        iVar7 = 0;
                        testing::internal::
                        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::reset(&local_40.message_,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )0x0);
                        iVar8 = (ring->read_index_).super___atomic_base<int>._M_i;
                        uVar1 = (ring->write_index_).super___atomic_base<int>._M_i;
                        if (iVar8 <= (int)uVar1) {
                          iVar7 = ring->capacity_;
                        }
                        local_50[0].ptr_._0_4_ = ~uVar1 + iVar8 + iVar7;
                        local_58.data_._0_4_ = 0x80;
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&local_40,"ring.available_write()","128",
                                   (int *)local_50,(int *)&local_58);
                        if (local_40.success_ == false) {
                          testing::Message::Message((Message *)local_50);
                          if (local_40.message_.ptr_ ==
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x0) {
                            pcVar5 = "";
                          }
                          else {
                            pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_58,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
                                     ,0x9b,pcVar5);
                          testing::internal::AssertHelper::operator=(&local_58,(Message *)local_50);
                          testing::internal::AssertHelper::~AssertHelper(&local_58);
                          if (((local_50[0].ptr_ !=
                                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                 *)0x0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
                             (local_50[0].ptr_ !=
                              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                               *)0x0)) {
                            (**(code **)(*(long *)local_50[0].ptr_ + 8))();
                          }
                        }
                        goto LAB_00117476;
                      }
                      testing::Message::Message((Message *)local_50);
                      if (local_40.message_.ptr_ ==
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
                      {
                        pcVar5 = "";
                      }
                      else {
                        pcVar5 = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
                      }
                      iVar8 = 0x9a;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/talonvoice[P]cubeb/test/test_ring_buffer.cpp"
             ,iVar8,pcVar5);
  testing::internal::AssertHelper::operator=(&local_58,(Message *)local_50);
  testing::internal::AssertHelper::~AssertHelper(&local_58);
  if (((local_50[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
      (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (local_50[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
    (**(code **)(*(long *)local_50[0].ptr_ + 8))();
  }
LAB_00117476:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

void basic_api_test(T& ring)
{
  ASSERT_EQ(ring.capacity(), 128);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);

  int rv = ring.enqueue_default(63);

  ASSERT_TRUE(rv == 63);
  ASSERT_EQ(ring.available_read(), 63);
  ASSERT_EQ(ring.available_write(), 65);

  rv = ring.enqueue_default(65);

  ASSERT_EQ(rv, 65);
  ASSERT_EQ(ring.available_read(), 128);
  ASSERT_EQ(ring.available_write(), 0);

  rv = ring.dequeue(nullptr, 63);

  ASSERT_EQ(ring.available_read(), 65);
  ASSERT_EQ(ring.available_write(), 63);

  rv = ring.dequeue(nullptr, 65);

  ASSERT_EQ(ring.available_read(), 0);
  ASSERT_EQ(ring.available_write(), 128);
}